

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_init.c
# Opt level: O3

void comm_test(MPI_Comm comm)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  char *__s;
  int iVar14;
  int ld;
  int hi [2];
  int lo [2];
  int rank;
  int dims [2];
  int local_6c;
  uint local_68;
  int local_64;
  uint local_60;
  uint local_5c;
  ulong local_58;
  uint local_50;
  int local_4c;
  ulong local_48;
  undefined1 local_3c [4];
  int local_38 [2];
  
  MPI_Comm_rank(comm,local_3c);
  iVar4 = GA_Initialize_comm(comm);
  if (iVar4 == 0) {
    return;
  }
  uVar5 = GA_Nodeid();
  local_50 = GA_Nnodes();
  iVar4 = (int)(uVar5 + 1) % (int)local_50;
  local_58 = (ulong)uVar5;
  if (uVar5 == 0) {
    printf("\nRunning comm_test on %d processors\n\n",(ulong)local_50);
  }
  iVar6 = NGA_Create_handle();
  local_38[0] = 0x100;
  local_38[1] = 0x100;
  NGA_Set_data(iVar6,2,local_38,0x3ec);
  NGA_Allocate(iVar6);
  GA_Zero(iVar6);
  local_4c = iVar6;
  NGA_Distribution(iVar6,iVar4,(int *)&local_60,(int *)&local_68);
  uVar10 = local_5c;
  uVar5 = local_60;
  iVar4 = local_64;
  local_48 = (ulong)local_68;
  uVar12 = local_68 + 1;
  iVar14 = (local_64 - local_5c) + 1;
  local_6c = iVar14;
  pvVar8 = malloc((long)(int)((uVar12 - local_60) * iVar14) << 3);
  iVar6 = local_4c;
  if ((int)uVar5 <= (int)local_48) {
    iVar7 = uVar5 * 0x100 + uVar10;
    iVar9 = 0;
    do {
      iVar11 = iVar14;
      iVar13 = iVar9;
      iVar3 = iVar7;
      if ((int)uVar10 <= iVar4) {
        do {
          *(double *)((long)pvVar8 + (long)iVar13 * 8) = (double)iVar3;
          iVar11 = iVar11 + -1;
          iVar13 = iVar13 + 1;
          iVar3 = iVar3 + 1;
        } while (iVar11 != 0);
      }
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + 0x100;
      iVar9 = iVar9 + iVar14;
    } while (uVar12 != uVar5);
  }
  NGA_Put(local_4c,(int *)&local_60,(int *)&local_68,pvVar8,&local_6c);
  GA_Sync();
  free(pvVar8);
  uVar5 = local_50;
  if (0 < (int)(uint)local_58) {
    uVar5 = (uint)local_58;
  }
  NGA_Distribution(iVar6,uVar5 - 1,(int *)&local_60,(int *)&local_68);
  local_6c = (local_64 - local_5c) + 1;
  uVar5 = ((local_68 - local_60) + 1) * local_6c;
  pvVar8 = malloc((long)(int)uVar5 * 8);
  if (0 < (int)uVar5) {
    memset(pvVar8,0,(ulong)uVar5 << 3);
  }
  NGA_Get(iVar6,(int *)&local_60,(int *)&local_68,pvVar8,&local_6c);
  if ((int)local_68 < (int)local_60) {
    free(pvVar8);
    if ((int)local_58 != 0) goto LAB_00103ba6;
    __s = "Test passed";
  }
  else {
    iVar6 = local_60 << 8;
    bVar2 = true;
    uVar5 = local_60;
    uVar10 = local_68;
    iVar4 = local_64;
    do {
      if ((int)local_5c <= iVar4) {
        iVar14 = uVar5 - local_60;
        uVar12 = local_5c;
        do {
          if ((bool)(bVar2 & (double)(int)(iVar6 + uVar12) !=
                             *(double *)
                              ((long)pvVar8 +
                              (long)(int)((local_6c * iVar14 - local_5c) + uVar12) * 8))) {
            printf("p[%d] Mismatch for (%d,%d) expected: %f actual: %f\n",local_58,(ulong)uVar5,
                   (ulong)uVar12);
            bVar2 = false;
            iVar4 = local_64;
          }
          bVar1 = (int)uVar12 < iVar4;
          uVar10 = local_68;
          uVar12 = uVar12 + 1;
        } while (bVar1);
      }
      iVar6 = iVar6 + 0x100;
      bVar1 = (int)uVar5 < (int)uVar10;
      uVar5 = uVar5 + 1;
    } while (bVar1);
    free(pvVar8);
    __s = "Test passed";
    if (!bVar2) {
      __s = "Test failed";
    }
    if ((int)local_58 != 0) {
      __s = "Test failed";
    }
    if ((int)local_58 != 0 && bVar2) goto LAB_00103ba6;
  }
  puts(__s);
LAB_00103ba6:
  GA_Terminate();
  return;
}

Assistant:

void comm_test(MPI_Comm comm)
{
  double *buf;
  int i, j, ii, jj, ld;
  int lo[2], hi[2];
  int dims[2];
  int two = 2;
  int g_a;
  int me, nprocs, prem;
  int nelems, ok;
  int rank;
  MPI_Comm_rank(comm,&rank);
  if (GA_Initialize_comm(comm)) {
    me = GA_Nodeid();
    nprocs = GA_Nnodes();
    prem = (me+1)%nprocs;
    if (me == 0) {
      printf("\nRunning comm_test on %d processors\n\n",nprocs);
    }

    g_a = NGA_Create_handle();
    dims[0] = DIM;
    dims[1] = DIM;
    NGA_Set_data(g_a,two,dims,C_DBL);
    NGA_Allocate(g_a);
    GA_Zero(g_a);

    /* Find out what section of global array I'm writing to */
    NGA_Distribution(g_a,prem,lo,hi);
    nelems = (hi[0]-lo[0]+1)*(hi[1]-lo[1]+1);
    ld = hi[1]-lo[1]+1;
    buf = (double*)malloc(nelems*sizeof(double));
    for (i=lo[0]; i<=hi[0]; i++) {
      ii = i-lo[0];
      for (j=lo[1]; j<=hi[1]; j++) {
        jj = j-lo[1];
        buf[ii*ld+jj] = (double)(i*DIM+j);
      }
    }
    NGA_Put(g_a,lo,hi,buf,&ld);
    GA_Sync();
    free(buf);
    /* Copy data from a different section of global array and check values */
    prem = me-1;
    if (prem < 0) prem = nprocs-1;
    NGA_Distribution(g_a,prem,lo,hi);
    nelems = (hi[0]-lo[0]+1)*(hi[1]-lo[1]+1);
    ld = hi[1]-lo[1]+1;
    buf = (double*)malloc(nelems*sizeof(double));
    for (i=0; i<nelems; i++) buf[i] = 0.0;
    NGA_Get(g_a,lo,hi,buf,&ld);

    ok = 1;
    for (i=lo[0]; i<=hi[0]; i++) {
      ii = i-lo[0];
      for (j=lo[1]; j<=hi[1]; j++) {
        jj = j-lo[1];
        if (buf[ii*ld+jj] != (double)(i*DIM+j)) {
          if (ok == 1) {
            printf("p[%d] Mismatch for (%d,%d) expected: %f actual: %f\n",
                me,i,j,buf[ii*ld+jj],(double)(i*DIM+j));
            ok = 0;
          }
        }
      }
    }
    free(buf);
    if (me == 0 && ok) {
      printf("Test passed\n");
    } else if (!ok) {
      printf("Test failed\n");
    }
    GA_Terminate();
  }
}